

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::FindNextProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,ScriptContext *scriptContext,
          PropertyIndex *index,JavascriptString **propertyStringName,PropertyId *propertyId,
          PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
          EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  PropertyIndex PVar1;
  PropertyId propertyId_00;
  DictionaryPropertyDescriptor<unsigned_short> DVar2;
  PropertyRecord *pPVar3;
  code *pcVar4;
  PropertyAttributes PVar5;
  bool bVar6;
  unsigned_short propIndex;
  undefined4 *puVar7;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar8;
  PropertyRecord **ppPVar9;
  PropertyString *this_00;
  PolymorphicInlineCache *polymorphicInlineCache;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  uint index_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  DictionaryPropertyDescriptor<unsigned_short> local_38;
  DictionaryPropertyDescriptor<unsigned_short> descriptor;
  
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x70,"(propertyStringName)","propertyStringName");
    if (!bVar6) goto LAB_00da6828;
    *puVar7 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x71,"(propertyId)","propertyId");
    if (!bVar6) goto LAB_00da6828;
    *puVar7 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x72,"(type)","type");
    if (!bVar6) {
LAB_00da6828:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  index_00 = (uint)*index;
  this_01 = (this->propertyMap).ptr;
  if ((int)(uint)*index < this_01->count - this_01->freeCount) {
    do {
      pDVar8 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_01,index_00);
      DVar2 = *pDVar8;
      local_38.Attributes = DVar2.Attributes;
      PVar5 = local_38.Attributes;
      local_38 = DVar2;
      if (((((ulong)DVar2 & 0x800) == 0) &&
          (((flags & EnumNonEnumerable) != None || (((ulong)DVar2 & 0x100) != 0)))) &&
         ((((ulong)DVar2 & 0x1000) == 0 ||
          ((((ulong)DVar2 & 0x1000) == 0 || (((ulong)DVar2 & 2) != 0)))))) {
        ppPVar9 = JsUtil::
                  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::GetKeyAt((this->propertyMap).ptr,(uint)*index);
        pPVar3 = *ppPVar9;
        if (((flags & EnumSymbols) != None) || (pPVar3->isSymbol == false)) {
          if (attributes != (PropertyAttributes *)0x0) {
            *attributes = PVar5;
          }
          propertyId_00 = pPVar3->pid;
          *propertyId = propertyId_00;
          this_00 = ScriptContext::GetPropertyString(scriptContext,propertyId_00);
          *propertyStringName = &this_00->super_JavascriptString;
          propIndex = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                                (&local_38);
          if ((((DynamicType *)type == typeToEnumerate) && (((ulong)DVar2 & 0x400) != 0)) &&
             (propIndex != 0xffff)) {
            polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_00);
            propertyRecordUsageCache = PropertyString::GetPropertyRecordUsageCache(this_00);
            PropertyValueInfo::SetCacheInfo
                      (info,(RecyclableObject *)this_00,propertyRecordUsageCache,
                       polymorphicInlineCache,false);
            SetPropertyValueInfo(this,info,&instance->super_RecyclableObject,propIndex,&local_38);
          }
          else if (info != (PropertyValueInfo *)0x0) {
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = 0xffff;
            info->m_attributes = '\0';
            info->flags = InlineCacheNoFlags;
          }
          return 1;
        }
      }
      PVar1 = *index;
      *index = PVar1 + 1;
      index_00 = (uint)(ushort)(PVar1 + 1);
      this_01 = (this->propertyMap).ptr;
    } while ((int)index_00 < this_01->count - this_01->freeCount);
  }
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
  return 0;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);

        for (; index < propertyMap->Count(); ++index)
        {
            DictionaryPropertyDescriptor<T> descriptor = propertyMap->GetValueAt(index);
            PropertyAttributes attribs = descriptor.Attributes;

            if (!(attribs & PropertyDeleted) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (attribs & PropertyEnumerable)) &&
                (!(attribs & PropertyLetConstGlobal) || descriptor.HasNonLetConstGlobal()))
            {
                const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(index);

                // Skip this property if it is a symbol and we are not including symbol properties
                if (!(flags & EnumeratorFlags::EnumSymbols) && propertyRecord->IsSymbol())
                {
                    continue;
                }

                // Pass back attributes of this property so caller can use them if it needs
                if (attributes != nullptr)
                {
                    *attributes = attribs;
                }

                *propertyId = propertyRecord->GetPropertyId();
                PropertyString* propertyString = scriptContext->GetPropertyString(*propertyId);
                *propertyStringName = propertyString;
                T dataSlot = descriptor.template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots && (attribs & PropertyWritable) && type == typeToEnumerate)
                {
                    PropertyValueInfo::SetCacheInfo(info, propertyString, propertyString->GetLdElemInlineCache(), false);
                    SetPropertyValueInfo(info, instance, dataSlot, &descriptor);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }